

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeeze.cpp
# Opt level: O0

int __thiscall ncnn::Squeeze::load_param(Squeeze *this,ParamDict *pd)

{
  int iVar1;
  ParamDict *in_RSI;
  Mat *in_RDI;
  undefined4 in_stack_ffffffffffffff40;
  int def;
  Mat *this_00;
  int in_stack_ffffffffffffff64;
  ParamDict *in_stack_ffffffffffffff68;
  Mat local_90 [2];
  ParamDict *local_10;
  
  def = 0;
  local_10 = in_RSI;
  iVar1 = ParamDict::get(in_RSI,0,0);
  *(int *)&in_RDI[2].cstep = iVar1;
  iVar1 = ParamDict::get(local_10,1,def);
  *(int *)((long)&in_RDI[2].cstep + 4) = iVar1;
  iVar1 = ParamDict::get(local_10,2,def);
  *(int *)&in_RDI[3].data = iVar1;
  this_00 = local_90;
  Mat::Mat(this_00);
  ParamDict::get(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,this_00);
  Mat::operator=(in_RDI,(Mat *)CONCAT44(def,in_stack_ffffffffffffff40));
  Mat::~Mat((Mat *)0x19a9c5);
  Mat::~Mat((Mat *)0x19a9cf);
  return 0;
}

Assistant:

int Squeeze::load_param(const ParamDict& pd)
{
    squeeze_w = pd.get(0, 0);
    squeeze_h = pd.get(1, 0);
    squeeze_c = pd.get(2, 0);
    axes = pd.get(3, Mat());

    return 0;
}